

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_minotaur.cpp
# Opt level: O1

int __thiscall
AMinotaur::DoSpecialDamage(AMinotaur *this,AActor *target,int damage,FName *damagetype)

{
  int iVar1;
  undefined1 local_14 [4];
  
  iVar1 = AActor::DoSpecialDamage(&this->super_AActor,target,damage,(FName)(int)local_14);
  if ((iVar1 != -1) && (((this->super_AActor).flags.Value & 0x1000000) != 0)) {
    P_MinotaurSlam(&this->super_AActor,target);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int AMinotaur::DoSpecialDamage (AActor *target, int damage, FName damagetype)
{
	damage = Super::DoSpecialDamage (target, damage, damagetype);
	if ((damage != -1) && (flags & MF_SKULLFLY))
	{ // Slam only when in charge mode
		P_MinotaurSlam (this, target);
		return -1;
	}
	return damage;
}